

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O1

int __thiscall QIconModeViewBase::itemIndex(QIconModeViewBase *this,QListViewItem *item)

{
  ulong uVar1;
  qsizetype qVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  
  uVar5 = item->indexHint;
  if ((-1 < (int)uVar5 && item->x <= (int)item->w + item->x + -1) &&
      item->y <= (int)item->h + item->y + -1) {
    uVar1 = (this->items).d.size;
    if (uVar5 < uVar1) {
      bVar3 = QListViewItem::operator==((this->items).d.ptr + uVar5,item);
      if (bVar3) {
        return uVar5;
      }
    }
    else {
      uVar5 = (int)uVar1 - 1;
    }
    qVar2 = (this->items).d.size;
    bVar4 = true;
    bVar3 = true;
    uVar7 = uVar5;
    do {
      if (bVar3) {
        lVar6 = (long)(int)uVar7;
        bVar3 = QListViewItem::operator==((this->items).d.ptr + lVar6,item);
        uVar8 = uVar7;
        if (bVar3) goto LAB_0057f8d6;
        uVar7 = uVar7 + 1;
        bVar3 = (int)uVar7 < (int)qVar2;
      }
      if (bVar4) {
        lVar6 = (long)(int)uVar5;
        bVar4 = QListViewItem::operator==((this->items).d.ptr + lVar6,item);
        uVar8 = uVar5;
        if (bVar4) {
LAB_0057f8d6:
          (this->items).d.ptr[lVar6].indexHint = uVar8;
          return uVar8;
        }
        bVar4 = 0 < (int)uVar5;
        uVar5 = uVar5 - 1;
      }
    } while ((bVar3) || (bVar4));
  }
  return -1;
}

Assistant:

int QIconModeViewBase::itemIndex(const QListViewItem &item) const
{
    if (!item.isValid())
        return -1;
    int i = item.indexHint;
    if (i < items.size()) {
        if (items.at(i) == item)
            return i;
    } else {
        i = items.size() - 1;
    }

    int j = i;
    int c = items.size();
    bool a = true;
    bool b = true;

    while (a || b) {
        if (a) {
            if (items.at(i) == item) {
                items.at(i).indexHint = i;
                return i;
            }
            a = ++i < c;
        }
        if (b) {
            if (items.at(j) == item) {
                items.at(j).indexHint = j;
                return j;
            }
            b = --j > -1;
        }
    }
    return -1;
}